

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_mtree.c
# Opt level: O0

wchar_t mtree_entry_new(archive_write *a,archive_entry *entry,mtree_entry_conflict **m_entry)

{
  uint uVar1;
  mode_t mVar2;
  mtree_entry_conflict *file;
  char *pcVar3;
  la_int64_t lVar4;
  time_t tVar5;
  long lVar6;
  dev_t dVar7;
  dir_info *pdVar8;
  reg_info *prVar9;
  size_t local_a0;
  size_t local_88;
  size_t local_70;
  size_t local_58;
  wchar_t r;
  char *s;
  mtree_entry_conflict *me;
  mtree_entry_conflict **m_entry_local;
  archive_entry *entry_local;
  archive_write *a_local;
  
  file = (mtree_entry_conflict *)calloc(1,0x150);
  if (file == (mtree_entry_conflict *)0x0) {
    archive_set_error(&a->archive,0xc,"Can\'t allocate memory for a mtree entry");
    *m_entry = (mtree_entry_conflict *)0x0;
    a_local._4_4_ = L'\xffffffe2';
  }
  else {
    a_local._4_4_ = mtree_entry_setup_filenames(a,file,entry);
    if (a_local._4_4_ < L'\xffffffec') {
      mtree_entry_free(file);
      *m_entry = (mtree_entry_conflict *)0x0;
    }
    else {
      pcVar3 = archive_entry_symlink(entry);
      if (pcVar3 != (char *)0x0) {
        (file->symlink).length = 0;
        if (pcVar3 == (char *)0x0) {
          local_58 = 0;
        }
        else {
          local_58 = strlen(pcVar3);
        }
        archive_strncat(&file->symlink,pcVar3,local_58);
      }
      uVar1 = archive_entry_nlink(entry);
      file->nlink = uVar1;
      mVar2 = archive_entry_filetype(entry);
      file->filetype = mVar2;
      mVar2 = archive_entry_mode(entry);
      file->mode = mVar2 & 0xfff;
      lVar4 = archive_entry_uid(entry);
      file->uid = lVar4;
      lVar4 = archive_entry_gid(entry);
      file->gid = lVar4;
      pcVar3 = archive_entry_uname(entry);
      if (pcVar3 != (char *)0x0) {
        (file->uname).length = 0;
        if (pcVar3 == (char *)0x0) {
          local_70 = 0;
        }
        else {
          local_70 = strlen(pcVar3);
        }
        archive_strncat(&file->uname,pcVar3,local_70);
      }
      pcVar3 = archive_entry_gname(entry);
      if (pcVar3 != (char *)0x0) {
        (file->gname).length = 0;
        if (pcVar3 == (char *)0x0) {
          local_88 = 0;
        }
        else {
          local_88 = strlen(pcVar3);
        }
        archive_strncat(&file->gname,pcVar3,local_88);
      }
      pcVar3 = archive_entry_fflags_text(entry);
      if (pcVar3 != (char *)0x0) {
        (file->fflags_text).length = 0;
        if (pcVar3 == (char *)0x0) {
          local_a0 = 0;
        }
        else {
          local_a0 = strlen(pcVar3);
        }
        archive_strncat(&file->fflags_text,pcVar3,local_a0);
      }
      archive_entry_fflags(entry,&file->fflags_set,&file->fflags_clear);
      tVar5 = archive_entry_mtime(entry);
      file->mtime = tVar5;
      lVar6 = archive_entry_mtime_nsec(entry);
      file->mtime_nsec = lVar6;
      dVar7 = archive_entry_rdevmajor(entry);
      file->rdevmajor = dVar7;
      dVar7 = archive_entry_rdevminor(entry);
      file->rdevminor = dVar7;
      dVar7 = archive_entry_devmajor(entry);
      file->devmajor = dVar7;
      dVar7 = archive_entry_devminor(entry);
      file->devminor = dVar7;
      lVar4 = archive_entry_ino(entry);
      file->ino = lVar4;
      lVar4 = archive_entry_size(entry);
      file->size = lVar4;
      if (file->filetype == 0x4000) {
        pdVar8 = (dir_info *)calloc(1,0x30);
        file->dir_info = pdVar8;
        if (file->dir_info == (dir_info *)0x0) {
          mtree_entry_free(file);
          archive_set_error(&a->archive,0xc,"Can\'t allocate memory for a mtree entry");
          *m_entry = (mtree_entry_conflict *)0x0;
          return L'\xffffffe2';
        }
        __archive_rb_tree_init(&file->dir_info->rbtree,&mtree_entry_new::rb_ops);
        (file->dir_info->children).first = (mtree_entry_conflict *)0x0;
        (file->dir_info->children).last = &(file->dir_info->children).first;
        file->dir_info->chnext = (mtree_entry_conflict *)0x0;
      }
      else if (file->filetype == 0x8000) {
        prVar9 = (reg_info *)calloc(1,0xd0);
        file->reg_info = prVar9;
        if (file->reg_info == (reg_info *)0x0) {
          mtree_entry_free(file);
          archive_set_error(&a->archive,0xc,"Can\'t allocate memory for a mtree entry");
          *m_entry = (mtree_entry_conflict *)0x0;
          return L'\xffffffe2';
        }
        file->reg_info->compute_sum = L'\0';
      }
      *m_entry = file;
      a_local._4_4_ = L'\0';
    }
  }
  return a_local._4_4_;
}

Assistant:

static int
mtree_entry_new(struct archive_write *a, struct archive_entry *entry,
    struct mtree_entry **m_entry)
{
	struct mtree_entry *me;
	const char *s;
	int r;
	static const struct archive_rb_tree_ops rb_ops = {
		mtree_entry_cmp_node, mtree_entry_cmp_key
	};

	me = calloc(1, sizeof(*me));
	if (me == NULL) {
		archive_set_error(&a->archive, ENOMEM,
		    "Can't allocate memory for a mtree entry");
		*m_entry = NULL;
		return (ARCHIVE_FATAL);
	}

	r = mtree_entry_setup_filenames(a, me, entry);
	if (r < ARCHIVE_WARN) {
		mtree_entry_free(me);
		*m_entry = NULL;
		return (r);
	}

	if ((s = archive_entry_symlink(entry)) != NULL)
		archive_strcpy(&me->symlink, s);
	me->nlink = archive_entry_nlink(entry);
	me->filetype = archive_entry_filetype(entry);
	me->mode = archive_entry_mode(entry) & 07777;
	me->uid = archive_entry_uid(entry);
	me->gid = archive_entry_gid(entry);
	if ((s = archive_entry_uname(entry)) != NULL)
		archive_strcpy(&me->uname, s);
	if ((s = archive_entry_gname(entry)) != NULL)
		archive_strcpy(&me->gname, s);
	if ((s = archive_entry_fflags_text(entry)) != NULL)
		archive_strcpy(&me->fflags_text, s);
	archive_entry_fflags(entry, &me->fflags_set, &me->fflags_clear);
	me->mtime = archive_entry_mtime(entry);
	me->mtime_nsec = archive_entry_mtime_nsec(entry);
	me->rdevmajor = archive_entry_rdevmajor(entry);
	me->rdevminor = archive_entry_rdevminor(entry);
	me->devmajor = archive_entry_devmajor(entry);
	me->devminor = archive_entry_devminor(entry);
	me->ino = archive_entry_ino(entry);
	me->size = archive_entry_size(entry);
	if (me->filetype == AE_IFDIR) {
		me->dir_info = calloc(1, sizeof(*me->dir_info));
		if (me->dir_info == NULL) {
			mtree_entry_free(me);
			archive_set_error(&a->archive, ENOMEM,
			    "Can't allocate memory for a mtree entry");
			*m_entry = NULL;
			return (ARCHIVE_FATAL);
		}
		__archive_rb_tree_init(&me->dir_info->rbtree, &rb_ops);
		me->dir_info->children.first = NULL;
		me->dir_info->children.last = &(me->dir_info->children.first);
		me->dir_info->chnext = NULL;
	} else if (me->filetype == AE_IFREG) {
		me->reg_info = calloc(1, sizeof(*me->reg_info));
		if (me->reg_info == NULL) {
			mtree_entry_free(me);
			archive_set_error(&a->archive, ENOMEM,
			    "Can't allocate memory for a mtree entry");
			*m_entry = NULL;
			return (ARCHIVE_FATAL);
		}
		me->reg_info->compute_sum = 0;
	}

	*m_entry = me;
	return (ARCHIVE_OK);
}